

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O2

void helper(string *tok,
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *temp,string *res)

{
  _Elt_pointer pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Elt_pointer pbVar5;
  ostream *poVar6;
  _Elt_pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = is_num(tok);
  if (bVar2) {
    std::operator+(&local_50,tok," ");
    std::__cxx11::string::append((string *)res);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar2 = std::operator==(tok,"(");
    if (bVar2) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp->c,tok);
      return;
    }
    bVar2 = std::operator==(tok,")");
    if (bVar2) {
      do {
        pbVar7 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pbVar7 == (temp->c).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_0010263c:
          std::operator<<((ostream *)&std::cout,"wrong bracer\n");
LAB_0010264f:
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&temp->c);
          return;
        }
        if (pbVar7 == (temp->c).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar7 = (temp->c).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        bVar2 = std::operator!=(pbVar7 + -1,"(");
        if (!bVar2) {
          if ((temp->c).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              (temp->c).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0010264f;
          goto LAB_0010263c;
        }
        std::__cxx11::string::append((string *)res);
        std::__cxx11::string::append((char *)res);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&temp->c);
      } while( true );
    }
    bVar2 = is_bin(tok);
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"invalid token ");
      poVar6 = std::operator<<(poVar6,(string *)tok);
      std::endl<char,std::char_traits<char>>(poVar6);
      return;
    }
    while (pbVar7 = (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur,
          pbVar7 != (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pbVar1 = (temp->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pbVar5 = pbVar7;
      if (pbVar7 == pbVar1) {
        pbVar5 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      iVar3 = prior(*pbVar5[-1]._M_dataplus._M_p);
      iVar4 = prior(*(tok->_M_dataplus)._M_p);
      if (iVar3 < iVar4) break;
      pbVar5 = pbVar7;
      if (pbVar7 == pbVar1) {
        pbVar5 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      iVar3 = prior(*pbVar5[-1]._M_dataplus._M_p);
      if (iVar3 == 2) break;
      if (pbVar7 == pbVar1) {
        pbVar7 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::operator+(&local_50,pbVar7 + -1," ");
      std::__cxx11::string::append((string *)res);
      std::__cxx11::string::~string((string *)&local_50);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&temp->c);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&temp->c,tok);
  }
  return;
}

Assistant:

void helper (const string& tok, stack<string>& temp, string& res) {
    if (is_num(tok)) res += tok + " ";
    else if (tok == "(") temp.push(tok);
    else if (tok == ")") {
        while (!temp.empty() && temp.top() != "(") {
            res += temp.top();
            res += " ";
            temp.pop();
        }
        if (temp.empty()) cout << "wrong bracer\n";
        temp.pop();
    } else if (is_bin(tok)) {
        while (!temp.empty() && (prior(temp.top()[0]) >= prior(tok[0])) && (prior(temp.top()[0]) != 2)) {
            res += temp.top() + " ";
            temp.pop();
        }
        temp.push(tok);
    } else cout << "invalid token " << tok << endl;
}